

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

void MAFSA_automaton_enumerate_ints
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               MAFSA_letter delim,void *user_data,MAFSA_automaton_string_handler fetcher)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  MAFSA_stack_struct local_48;
  
  puVar1 = ma->ptr_nodes;
  uVar2 = *puVar1;
  local_48.current = -1;
  uVar3 = 0;
  local_48.buffer = tmp;
  local_48.reserved = sz_tmp;
  while( true ) {
    uVar4 = (ulong)uVar3;
    if (sz_l <= uVar4) {
      if ((uVar4 == sz_l) && (uVar2 = MAFSA_delta(ma->ptr_links,uVar2,delim), uVar2 != 0)) {
        enumerate_ints(ma,&local_48,puVar1[uVar2],fetcher,user_data);
      }
      return;
    }
    uVar2 = MAFSA_delta(ma->ptr_links,uVar2,l[uVar4]);
    if (uVar2 == 0) break;
    uVar2 = puVar1[uVar2];
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

static void MAFSA_automaton_enumerate_ints(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, MAFSA_letter delim, void *user_data, MAFSA_automaton_string_handler fetcher)
{
    uint32_t i;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 1;

    struct MAFSA_stack_struct tmp_stack;

    tmp_stack.buffer   = tmp;
    tmp_stack.reserved = sz_tmp;
    tmp_stack.current  = -1;

    for (i = 0; i < sz_l; i++)
    {
        MAFSA_letter label = l[i];

        if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if (i == sz_l && where)
    {
        if (0 != (where = MAFSA_delta(ma->ptr_links, current, delim)))
        {
            enumerate_ints(ma, &tmp_stack, ma->ptr_nodes[where], fetcher, user_data);
        }
    }
}